

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O1

CURLcode Curl_pin_peer_pubkey(Curl_easy *data,char *pinnedpubkey,uchar *pubkey,size_t pubkeylen)

{
  curl_trc_feat *pcVar1;
  bool bVar2;
  size_t sVar3;
  int iVar4;
  CURLcode CVar5;
  CURLcode CVar6;
  FILE *__stream;
  ulong sonum;
  size_t sVar7;
  size_t sVar8;
  uchar *puVar9;
  char *pcVar10;
  char *__haystack;
  char *__haystack_00;
  CURLcode CVar11;
  size_t sVar12;
  uchar *pem_ptr;
  dynbuf buf;
  size_t pem_len;
  uchar *local_468;
  dynbuf local_460;
  size_t local_440;
  size_t local_438 [129];
  
  if (pinnedpubkey == (char *)0x0) {
    return CURLE_OK;
  }
  if (pubkeylen == 0 || pubkey == (uchar *)0x0) {
    return CURLE_SSL_PINNEDPUBKEYNOTMATCH;
  }
  iVar4 = strncmp(pinnedpubkey,"sha256//",8);
  if (iVar4 == 0) {
    bVar2 = false;
    local_438[0] = 0;
    local_460.bufr = (char *)0x0;
    CVar6 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
    if (Curl_ssl->sha256sum == (_func_CURLcode_uchar_ptr_size_t_uchar_ptr_size_t *)0x0) {
      CVar11 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
    }
    else {
      puVar9 = (uchar *)(*Curl_cmalloc)(0x20);
      CVar11 = CURLE_OUT_OF_MEMORY;
      CVar5 = CVar11;
      if (puVar9 != (uchar *)0x0) {
        CVar5 = (*Curl_ssl->sha256sum)(pubkey,pubkeylen,puVar9,0x20);
        if (CVar5 == CURLE_OK) {
          CVar5 = Curl_base64_encode((char *)puVar9,0x20,&local_460.bufr,local_438);
        }
        (*Curl_cfree)(puVar9);
        if (CVar5 == CURLE_OK) {
          CVar6 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
          if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
             ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 ||
              (0 < pcVar1->log_level)))) {
            Curl_infof(data," public key hash: sha256//%s",local_460.bufr);
          }
          pcVar10 = (*Curl_cstrdup)(pinnedpubkey);
          __haystack_00 = pcVar10;
          if (pcVar10 == (char *)0x0) {
            (*Curl_cfree)(local_460.bufr);
            bVar2 = false;
          }
          else {
            while( true ) {
              __haystack = strstr(__haystack_00,";sha256//");
              sVar3 = local_438[0];
              if (__haystack != (char *)0x0) {
                *__haystack = '\0';
              }
              sVar12 = strlen(__haystack_00 + 8);
              if ((sVar3 == sVar12) &&
                 (iVar4 = bcmp(local_460.bufr,__haystack_00 + 8,sVar3), iVar4 == 0)) break;
              if (__haystack != (char *)0x0) {
                *__haystack = ';';
                __haystack_00 = strstr(__haystack,"sha256//");
              }
              CVar6 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
              if ((__haystack == (char *)0x0) || (__haystack_00 == (char *)0x0)) goto LAB_00175faa;
            }
            CVar6 = CURLE_OK;
LAB_00175faa:
            CVar11 = 0x1a6168;
            (*Curl_cfree)(local_460.bufr);
            local_460.bufr = (char *)0x0;
            (*Curl_cfree)(pcVar10);
            bVar2 = true;
          }
          goto joined_r0x00175e97;
        }
      }
      bVar2 = false;
      CVar6 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
      CVar11 = CVar5;
    }
    goto joined_r0x00175e97;
  }
  local_468 = (uchar *)0x0;
  __stream = fopen64(pinnedpubkey,"rb");
  CVar11 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
  if (__stream == (FILE *)0x0) {
    bVar2 = false;
    CVar6 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
    goto joined_r0x00175e97;
  }
  Curl_dyn_init(&local_460,0x100000);
  iVar4 = fseek(__stream,0,2);
  CVar6 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
  if (iVar4 == 0) {
    sonum = ftell(__stream);
    iVar4 = fseek(__stream,0,0);
    if (((sonum < 0x100001) && (iVar4 == 0)) &&
       (sVar7 = curlx_sotouz(sonum), sVar3 = sVar7, pubkeylen <= sVar7)) {
      do {
        local_440 = sVar3;
        sVar12 = 0x400;
        if (sVar7 < 0x400) {
          sVar12 = sVar7;
        }
        sVar8 = fread(local_438,1,sVar12,__stream);
        if (sVar12 == sVar8) {
          CVar5 = Curl_dyn_addn(&local_460,local_438,sVar12);
          if (CVar5 != CURLE_OK) {
            CVar5 = CURLE_FTP_WEIRD_227_FORMAT;
            sVar12 = 0;
          }
          sVar7 = sVar7 - sVar12;
        }
        else {
          CVar5 = CURLE_FTP_WEIRD_227_FORMAT;
        }
        if (CVar5 != CURLE_OK) {
          CVar6 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
          if (CVar5 == CURLE_FTP_WEIRD_227_FORMAT) goto LAB_00175cb6;
          bVar2 = false;
          goto joined_r0x00175e97;
        }
        sVar3 = local_440;
      } while (sVar7 != 0);
      puVar9 = (uchar *)Curl_dyn_ptr(&local_460);
      if (local_440 == pubkeylen) {
LAB_00175fff:
        iVar4 = bcmp(pubkey,puVar9,pubkeylen);
        CVar6 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
        if (iVar4 == 0) {
          CVar6 = CURLE_OK;
        }
      }
      else {
        CVar6 = pubkey_pem_to_der((char *)puVar9,&local_468,local_438);
        if (CVar6 == CURLE_OK) {
          CVar6 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
          puVar9 = local_468;
          if (local_438[0] == pubkeylen) goto LAB_00175fff;
        }
        else {
          CVar6 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
        }
      }
    }
  }
LAB_00175cb6:
  Curl_dyn_free(&local_460);
  (*Curl_cfree)(local_468);
  local_468 = (uchar *)0x0;
  fclose(__stream);
  bVar2 = true;
joined_r0x00175e97:
  if (bVar2) {
    CVar11 = CVar6;
  }
  return CVar11;
}

Assistant:

CURLcode Curl_pin_peer_pubkey(struct Curl_easy *data,
                              const char *pinnedpubkey,
                              const unsigned char *pubkey, size_t pubkeylen)
{
  CURLcode result = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
#ifdef CURL_DISABLE_VERBOSE_STRINGS
  (void)data;
#endif

  /* if a path was not specified, do not pin */
  if(!pinnedpubkey)
    return CURLE_OK;
  if(!pubkey || !pubkeylen)
    return result;

  /* only do this if pinnedpubkey starts with "sha256//", length 8 */
  if(!strncmp(pinnedpubkey, "sha256//", 8)) {
    CURLcode encode;
    size_t encodedlen = 0;
    char *encoded = NULL, *pinkeycopy, *begin_pos, *end_pos;
    unsigned char *sha256sumdigest;

    if(!Curl_ssl->sha256sum) {
      /* without sha256 support, this cannot match */
      return result;
    }

    /* compute sha256sum of public key */
    sha256sumdigest = malloc(CURL_SHA256_DIGEST_LENGTH);
    if(!sha256sumdigest)
      return CURLE_OUT_OF_MEMORY;
    encode = Curl_ssl->sha256sum(pubkey, pubkeylen,
                                 sha256sumdigest, CURL_SHA256_DIGEST_LENGTH);

    if(!encode)
      encode = Curl_base64_encode((char *)sha256sumdigest,
                                  CURL_SHA256_DIGEST_LENGTH, &encoded,
                                  &encodedlen);
    Curl_safefree(sha256sumdigest);

    if(encode)
      return encode;

    infof(data, " public key hash: sha256//%s", encoded);

    /* it starts with sha256//, copy so we can modify it */
    pinkeycopy = strdup(pinnedpubkey);
    if(!pinkeycopy) {
      Curl_safefree(encoded);
      return CURLE_OUT_OF_MEMORY;
    }
    /* point begin_pos to the copy, and start extracting keys */
    begin_pos = pinkeycopy;
    do {
      end_pos = strstr(begin_pos, ";sha256//");
      /*
       * if there is an end_pos, null terminate,
       * otherwise it will go to the end of the original string
       */
      if(end_pos)
        end_pos[0] = '\0';

      /* compare base64 sha256 digests, 8 is the length of "sha256//" */
      if(encodedlen == strlen(begin_pos + 8) &&
         !memcmp(encoded, begin_pos + 8, encodedlen)) {
        result = CURLE_OK;
        break;
      }

      /*
       * change back the null-terminator we changed earlier,
       * and look for next begin
       */
      if(end_pos) {
        end_pos[0] = ';';
        begin_pos = strstr(end_pos, "sha256//");
      }
    } while(end_pos && begin_pos);
    Curl_safefree(encoded);
    Curl_safefree(pinkeycopy);
  }
  else {
    long filesize;
    size_t size, pem_len;
    CURLcode pem_read;
    struct dynbuf buf;
    char unsigned *pem_ptr = NULL;
    size_t left;
    FILE *fp = fopen(pinnedpubkey, "rb");
    if(!fp)
      return result;

    Curl_dyn_init(&buf, MAX_PINNED_PUBKEY_SIZE);

    /* Determine the file's size */
    if(fseek(fp, 0, SEEK_END))
      goto end;
    filesize = ftell(fp);
    if(fseek(fp, 0, SEEK_SET))
      goto end;
    if(filesize < 0 || filesize > MAX_PINNED_PUBKEY_SIZE)
      goto end;

    /*
     * if the size of our certificate is bigger than the file
     * size then it cannot match
     */
    size = curlx_sotouz((curl_off_t) filesize);
    if(pubkeylen > size)
      goto end;

    /*
     * Read the file into the dynbuf
     */
    left = size;
    do {
      char buffer[1024];
      size_t want = left > sizeof(buffer) ? sizeof(buffer) : left;
      if(want != fread(buffer, 1, want, fp))
        goto end;
      if(Curl_dyn_addn(&buf, buffer, want))
        goto end;
      left -= want;
    } while(left);

    /* If the sizes are the same, it cannot be base64 encoded, must be der */
    if(pubkeylen == size) {
      if(!memcmp(pubkey, Curl_dyn_ptr(&buf), pubkeylen))
        result = CURLE_OK;
      goto end;
    }

    /*
     * Otherwise we will assume it is PEM and try to decode it
     * after placing null terminator
     */
    pem_read = pubkey_pem_to_der(Curl_dyn_ptr(&buf), &pem_ptr, &pem_len);
    /* if it was not read successfully, exit */
    if(pem_read)
      goto end;

    /*
     * if the size of our certificate does not match the size of
     * the decoded file, they cannot be the same, otherwise compare
     */
    if(pubkeylen == pem_len && !memcmp(pubkey, pem_ptr, pubkeylen))
      result = CURLE_OK;
end:
    Curl_dyn_free(&buf);
    Curl_safefree(pem_ptr);
    fclose(fp);
  }

  return result;
}